

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcResub.c
# Opt level: O0

Dec_Graph_t * Abc_ManResubQuit1(Abc_Obj_t *pRoot,Abc_Obj_t *pObj0,Abc_Obj_t *pObj1,int fOrGate)

{
  uint uVar1;
  uint uVar2;
  Dec_Edge_t eEdge0;
  Dec_Edge_t eEdge1;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *pAVar4;
  Dec_Graph_t *pGraph_00;
  Dec_Node_t *pDVar5;
  Dec_Edge_t eNode1;
  Dec_Edge_t eNode0;
  Dec_Edge_t eRoot;
  Dec_Graph_t *pGraph;
  int fOrGate_local;
  Abc_Obj_t *pObj1_local;
  Abc_Obj_t *pObj0_local;
  Abc_Obj_t *pRoot_local;
  
  pAVar3 = Abc_ObjRegular(pObj0);
  pAVar4 = Abc_ObjRegular(pObj1);
  if (pAVar3 != pAVar4) {
    pGraph_00 = Dec_GraphCreate(2);
    pAVar3 = Abc_ObjRegular(pObj0);
    pDVar5 = Dec_GraphNode(pGraph_00,0);
    (pDVar5->field_2).pFunc = pAVar3;
    pAVar3 = Abc_ObjRegular(pObj1);
    pDVar5 = Dec_GraphNode(pGraph_00,1);
    (pDVar5->field_2).pFunc = pAVar3;
    pAVar3 = Abc_ObjRegular(pObj0);
    uVar1 = *(uint *)&pAVar3->field_0x14;
    uVar2 = Abc_ObjIsComplement(pObj0);
    eEdge0 = Dec_EdgeCreate(0,uVar1 >> 7 & 1 ^ uVar2);
    pAVar3 = Abc_ObjRegular(pObj1);
    uVar1 = *(uint *)&pAVar3->field_0x14;
    uVar2 = Abc_ObjIsComplement(pObj1);
    eEdge1 = Dec_EdgeCreate(1,uVar1 >> 7 & 1 ^ uVar2);
    if (fOrGate == 0) {
      eNode1 = Dec_GraphAddNodeAnd(pGraph_00,eEdge0,eEdge1);
    }
    else {
      eNode1 = Dec_GraphAddNodeOr(pGraph_00,eEdge0,eEdge1);
    }
    Dec_GraphSetRoot(pGraph_00,eNode1);
    if ((*(uint *)&pRoot->field_0x14 >> 7 & 1) != 0) {
      Dec_GraphComplement(pGraph_00);
    }
    return pGraph_00;
  }
  __assert_fail("Abc_ObjRegular(pObj0) != Abc_ObjRegular(pObj1)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcResub.c"
                ,0x28d,"Dec_Graph_t *Abc_ManResubQuit1(Abc_Obj_t *, Abc_Obj_t *, Abc_Obj_t *, int)")
  ;
}

Assistant:

Dec_Graph_t * Abc_ManResubQuit1( Abc_Obj_t * pRoot, Abc_Obj_t * pObj0, Abc_Obj_t * pObj1, int fOrGate )
{
    Dec_Graph_t * pGraph;
    Dec_Edge_t eRoot, eNode0, eNode1;
    assert( Abc_ObjRegular(pObj0) != Abc_ObjRegular(pObj1) );
    pGraph = Dec_GraphCreate( 2 );
    Dec_GraphNode( pGraph, 0 )->pFunc = Abc_ObjRegular(pObj0);
    Dec_GraphNode( pGraph, 1 )->pFunc = Abc_ObjRegular(pObj1);
    eNode0 = Dec_EdgeCreate( 0, Abc_ObjRegular(pObj0)->fPhase ^ Abc_ObjIsComplement(pObj0) );
    eNode1 = Dec_EdgeCreate( 1, Abc_ObjRegular(pObj1)->fPhase ^ Abc_ObjIsComplement(pObj1) );
    if ( fOrGate ) 
        eRoot  = Dec_GraphAddNodeOr( pGraph, eNode0, eNode1 );
    else
        eRoot  = Dec_GraphAddNodeAnd( pGraph, eNode0, eNode1 );
    Dec_GraphSetRoot( pGraph, eRoot );
    if ( pRoot->fPhase )
        Dec_GraphComplement( pGraph );
    return pGraph;
}